

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_helper.c
# Opt level: O2

void helper_v7m_vlldm_aarch64(CPUARMState_conflict *env,uint32_t fptr)

{
  uint uVar1;
  _Bool _Var2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  target_ulong ptr;
  uint uVar8;
  uintptr_t unaff_retaddr;
  
  if ((env->v7m).secure == 0) {
    __assert_fail("env->v7m.secure",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/m_helper.c"
                  ,0x407,"void helper_v7m_vlldm_aarch64(CPUARMState *, uint32_t)");
  }
  uVar7 = (env->v7m).control[1];
  if ((uVar7 & 8) != 0) {
    ptr = (target_ulong)fptr;
    iVar3 = arm_current_el(env);
    _Var2 = v7m_cpacr_pass(env,true,iVar3 != 0);
    if (!_Var2) {
      uVar4 = 0x11;
LAB_005b6111:
      raise_exception_ra_aarch64(env,uVar4,0,1,unaff_retaddr);
    }
    uVar1 = (env->v7m).fpccr[1];
    if ((uVar1 & 1) == 0) {
      if ((fptr & 7) != 0) {
        uVar4 = 0x16;
        goto LAB_005b6111;
      }
      uVar7 = 0;
      for (uVar8 = 0; uVar8 < (uVar1 >> 0x16 & 0x10) + 0x10; uVar8 = uVar8 + 2) {
        uVar6 = (int)ptr + 8;
        if (0xf < uVar8) {
          ptr = (target_ulong)uVar6;
        }
        uVar4 = cpu_ldl_data_ra_aarch64(env,ptr,unaff_retaddr);
        uVar5 = cpu_ldl_data_ra_aarch64(env,(ulong)((uint)ptr | 4),unaff_retaddr);
        (env->vfp).zregs[uVar8 >> 2].d[uVar7 & 1] = CONCAT44(uVar5,uVar4);
        uVar7 = uVar7 + 1;
        ptr = (target_ulong)uVar6;
      }
      uVar4 = cpu_ldl_data_ra_aarch64(env,(ulong)(fptr + 0x40),unaff_retaddr);
      vfp_set_fpscr_aarch64(env,uVar4);
      uVar7 = (env->v7m).control[1];
    }
    else {
      (env->v7m).fpccr[1] = uVar1 & 0xfffffffe;
    }
    (env->v7m).control[1] = uVar7 | 4;
  }
  return;
}

Assistant:

void HELPER(v7m_vlldm)(CPUARMState *env, uint32_t fptr)
{
    uintptr_t ra = GETPC();

    /* fptr is the value of Rn, the frame pointer we load the FP regs from */
    assert(env->v7m.secure);

    if (!(env->v7m.control[M_REG_S] & R_V7M_CONTROL_SFPA_MASK)) {
        return;
    }

    /* Check access to the coprocessor is permitted */
    if (!v7m_cpacr_pass(env, true, arm_current_el(env) != 0)) {
        raise_exception_ra(env, EXCP_NOCP, 0, 1, GETPC());
    }

    if (env->v7m.fpccr[M_REG_S] & R_V7M_FPCCR_LSPACT_MASK) {
        /* State in FP is still valid */
        env->v7m.fpccr[M_REG_S] &= ~R_V7M_FPCCR_LSPACT_MASK;
    } else {
        bool ts = env->v7m.fpccr[M_REG_S] & R_V7M_FPCCR_TS_MASK;
        int i;
        uint32_t fpscr;

        if (fptr & 7) {
            raise_exception_ra(env, EXCP_UNALIGNED, 0, 1, GETPC());
        }

        for (i = 0; i < (ts ? 32 : 16); i += 2) {
            uint32_t slo, shi;
            uint64_t dn;
            uint32_t faddr = fptr + 4 * i;

            if (i >= 16) {
                faddr += 8; /* skip the slot for the FPSCR */
            }

            slo = cpu_ldl_data_ra(env, faddr, ra);
            shi = cpu_ldl_data_ra(env, faddr + 4, ra);

            dn = (uint64_t) shi << 32 | slo;
            *aa32_vfp_dreg(env, i / 2) = dn;
        }
        fpscr = cpu_ldl_data_ra(env, fptr + 0x40, ra);
        vfp_set_fpscr(env, fpscr);
    }

    env->v7m.control[M_REG_S] |= R_V7M_CONTROL_FPCA_MASK;
}